

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void __thiscall TestMaterial::initializeUniverse(TestMaterial *this)

{
  double dVar1;
  S_Box *pSVar2;
  S_Sphere *pSVar3;
  S_Superellipsoid *pSVar4;
  S_Point *this_00;
  void *pvVar5;
  S_Cone *this_01;
  ostream *poVar6;
  STP_BV *pSVar7;
  double dVar8;
  S_Object *pSVar9;
  size_t sVar10;
  double local_198;
  double local_190;
  double local_188;
  undefined1 local_180 [8];
  Vector3 position;
  size_t i;
  string local_158 [32];
  STP_BV *local_138;
  STP_BV *s2;
  string local_128 [32];
  STP_BV *local_108;
  STP_BV *s1;
  double local_f8;
  double local_f0;
  Vector3T<double,_false> local_e8;
  double local_d0;
  double local_c8;
  double local_c0;
  Vector3T<double,_false> local_b8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  Vector3T<double,_false> local_78;
  double local_60;
  double local_58;
  double local_50;
  Vector3T<double,_false> local_48;
  double local_30;
  double local_28 [3];
  TestMaterial *local_10;
  TestMaterial *this_local;
  
  local_10 = this;
  if ((this->nonSTPBV_ & 1U) != 0) {
    pSVar2 = (S_Box *)operator_new(0xa8);
    sch::S_Box::S_Box(pSVar2,0.2,0.2,0.2);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar2 = (S_Box *)operator_new(0xa8);
    sch::S_Box::S_Box(pSVar2,0.2,0.2,0.2);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar3 = (S_Sphere *)operator_new(0x98);
    local_28[0] = 0.1;
    sch::S_Sphere::S_Sphere(pSVar3,local_28);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar3 = (S_Sphere *)operator_new(0x98);
    local_30 = 0.12;
    sch::S_Sphere::S_Sphere(pSVar3,&local_30);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar4 = (S_Superellipsoid *)operator_new(0xd8);
    sch::S_Superellipsoid::S_Superellipsoid(pSVar4,0.25,0.3,0.3,0.9,0.2);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar4 = (S_Superellipsoid *)operator_new(0xd8);
    sch::S_Superellipsoid::S_Superellipsoid(pSVar4,0.11,0.3,0.14,0.4,0.8);
    sch::CD_Scene::addObject((S_Object *)this);
    this_00 = (S_Point *)operator_new(0x98);
    sch::S_Point::S_Point(this_00);
    sch::CD_Scene::addObject((S_Object *)this);
    pvVar5 = operator_new(200);
    local_50 = 0.1;
    local_58 = 0.1;
    local_60 = 0.1;
    CD_Matrix::Vector3T<double,_false>::Vector3T(&local_48,&local_50,&local_58,&local_60);
    local_80 = -0.1;
    local_88 = -0.1;
    local_90 = -0.1;
    CD_Matrix::Vector3T<double,_false>::Vector3T(&local_78,&local_80,&local_88,&local_90);
    sch::S_Capsule::S_Capsule((S_Capsule *)0x9999999a,pvVar5);
    sch::CD_Scene::addObject((S_Object *)this);
    this_01 = (S_Cone *)operator_new(0xb0);
    local_98 = 0.5;
    local_a0 = 0.3;
    sch::S_Cone::S_Cone(this_01,&local_98,&local_a0);
    sch::CD_Scene::addObject((S_Object *)this);
    pvVar5 = operator_new(0xe0);
    local_c0 = 0.1;
    local_c8 = 0.1;
    local_d0 = 0.1;
    CD_Matrix::Vector3T<double,_false>::Vector3T(&local_b8,&local_c0,&local_c8,&local_d0);
    local_f0 = -0.1;
    local_f8 = -0.1;
    s1 = (STP_BV *)0xbfb999999999999a;
    CD_Matrix::Vector3T<double,_false>::Vector3T(&local_e8,&local_f0,&local_f8,(double *)&s1);
    sch::S_Cylinder::S_Cylinder((S_Cylinder *)0x9999999a,pvVar5);
    sch::CD_Scene::addObject((S_Object *)this);
    poVar6 = std::operator<<((ostream *)&std::cout,"10 Non-STP BV Objects added to scene");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  pSVar7 = (STP_BV *)operator_new(0xe8);
  sch::STP_BV::STP_BV(pSVar7);
  local_108 = pSVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"sample_stpbv1.txt",(allocator<char> *)((long)&s2 + 7));
  (**(code **)(*(long *)pSVar7 + 0x48))(pSVar7,local_128);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s2 + 7));
  sch::CD_Scene::addObject((S_Object *)this);
  pSVar7 = (STP_BV *)operator_new(0xe8);
  sch::STP_BV::STP_BV(pSVar7);
  local_138 = pSVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"sample_stpbv2.txt",(allocator<char> *)((long)&i + 7));
  (**(code **)(*(long *)pSVar7 + 0x48))(pSVar7,local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  sch::CD_Scene::addObject((S_Object *)this);
  poVar6 = std::operator<<((ostream *)&std::cout,"2 STP-BVs loaded and added to the scene");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  position.m_z = 0.0;
  while( true ) {
    dVar1 = position.m_z;
    dVar8 = (double)sch::CD_Scene::size(&this->sObj);
    if ((ulong)dVar8 <= (ulong)dVar1) break;
    local_188 = (double)((int)((long)position.m_z * 7) +
                        (int)((ulong)((long)position.m_z * 7) / 5) * -5) + -2.0;
    local_190 = ((double)((int)((long)position.m_z * 5) +
                         (int)((ulong)((long)position.m_z * 5) / 6) * -6) + -3.0) *
                0.8333333333333334;
    local_198 = ((double)((int)((long)position.m_z * 5) +
                         (int)((ulong)((long)position.m_z * 5) / 7) * -7) - 3.0) *
                0.7142857142857143;
    CD_Matrix::Vector3T<double,_false>::Vector3T
              ((Vector3T<double,_false> *)local_180,&local_188,&local_190,&local_198);
    CD_Matrix::Vector3T<double,_false>::operator*=
              ((Vector3T<double,_false> *)local_180,(double *)&DispersionScale);
    pSVar9 = sch::CD_Scene::operator[](&this->sObj,(size_t)position.m_z);
    sch::S_Object::setPosition(pSVar9);
    position.m_z = (double)((long)position.m_z + 1);
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"A total of ");
  sVar10 = sch::CD_Scene::size(&this->sObj);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar10);
  poVar6 = std::operator<<(poVar6," objects in the scene");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  DoTest(this);
  return;
}

Assistant:

void TestMaterial::initializeUniverse()
{
  if (nonSTPBV_)
  {
    sObj.addObject(new S_Box(0.2,0.2,0.2));
    sObj.addObject(new S_Box(0.2,0.2,0.2));
    sObj.addObject(new S_Sphere(0.1));
    sObj.addObject(new S_Sphere(0.12));

    sObj.addObject(new S_Superellipsoid(.25,.30,.30,0.9,0.2));
    sObj.addObject(new S_Superellipsoid(.11,.30,.14,0.4,0.8));
    sObj.addObject(new S_Point());
    sObj.addObject(new S_Capsule(Point3(0.1,0.1,0.1),Point3(-0.1,-0.1,-0.1),0.2));
    sObj.addObject(new S_Cone(0.5,0.3));
    sObj.addObject(new S_Cylinder(Point3(0.1,0.1,0.1),Point3(-0.1,-0.1,-0.1),0.2));

    std::cout << "10 Non-STP BV Objects added to scene" << std::endl;
  }

#ifdef MULTI_OBJECTS_TEST
  {
    bool b=true;
    int i=0;
    do
    {
      std::string s;
      s="";
      std::stringstream istr;
      istr<<std::string("C:/Mehdi/nuage_points/simplifies/testspace/jobj(")<<i<<").txt";


      getline(istr,s);
      std::fstream testfile;
      testfile.open(s.c_str());

      if (testfile.is_open())
      {
        b=true;
        testfile.close();

        //STP_BV stp;
        STP_BV_P stp;
        stp.constructFromFileWithGL(s.c_str());

        stppObjects.push_back(stp);
        //  stpObjects.push_back(stp);
      }
      else
        b=false;

      i++;

      //if (i==8) b=false;


    }
    while(b);

    for (int j=0; j<stppObjects.size(); j++)
    {
      sObj.addObject(&(stppObjects[j]));
    }

    std::cout << "Multi Object loaded and added to the scene" << std::endl;
  }
#else
  {
    STP_BV* s1 = new STP_BV();
    s1->constructFromFileWithGL("sample_stpbv1.txt");
    sObj.addObject(s1);

    STP_BV* s2 = new STP_BV();
    s2->constructFromFileWithGL("sample_stpbv2.txt");
    sObj.addObject(s2);
    std::cout << "2 STP-BVs loaded and added to the scene" << std::endl;
  }
#endif
  for (size_t i=0; i<sObj.size(); i++)
  {
    Vector3 position(
      Scalar(7*i%5)-2.,
      (Scalar(5*i%6)-3.)*(5.0/6.),
      (Scalar(5*i%7)-3.)*(5.0/7.)
    );
    position *= DispersionScale;
    sObj[i]->setPosition(position);
  }

  std::cout << "A total of "<< sObj.size() <<" objects in the scene"<<std::endl;

  DoTest();
}